

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceputils.c
# Opt level: O0

char * key_fingerprint(X509_REQ *req)

{
  uchar *puVar1;
  BIO_METHOD *type;
  BIO *bp;
  EVP_PKEY *pkey;
  long lVar2;
  undefined1 local_a4 [8];
  MD5_CTX ctx;
  BIO *bio;
  int len;
  int c;
  uchar md [16];
  uchar *data;
  char *str;
  char *ret;
  X509_REQ *req_local;
  
  puVar1 = (uchar *)malloc(0x21);
  type = BIO_s_mem();
  bp = BIO_new(type);
  ctx._84_8_ = bp;
  pkey = X509_REQ_get_pubkey((X509_REQ *)req);
  i2d_PUBKEY_bio(bp,pkey);
  lVar2 = BIO_ctrl((BIO *)ctx._84_8_,3,0,md + 8);
  MD5_Init((MD5_CTX *)local_a4);
  MD5_Update((MD5_CTX *)local_a4,(void *)md._8_8_,(long)(int)lVar2);
  MD5_Final((uchar *)&len,(MD5_CTX *)local_a4);
  data = puVar1;
  for (bio._4_4_ = 0; bio._4_4_ < 0x10; bio._4_4_ = bio._4_4_ + 1) {
    sprintf((char *)data,"%02X",(ulong)*(byte *)((long)&len + (long)bio._4_4_));
    data = data + 2;
  }
  *data = '\0';
  return (char *)puVar1;
}

Assistant:

char* key_fingerprint(X509_REQ *req) {
    char           *ret, *str;
    unsigned char  *data, md[MD5_DIGEST_LENGTH];
    int            c, len;
    BIO            *bio;
    MD5_CTX        ctx;

    // Assign space for ASCII presentation of the digest
    str = (unsigned char *)malloc(2 * MD5_DIGEST_LENGTH + 1);
    ret = str;

    // Create new memory bio for reading the public key
    bio = BIO_new(BIO_s_mem());
    i2d_PUBKEY_bio(bio, X509_REQ_get_pubkey(req));
    len = BIO_get_mem_data(bio, &data);

    // Calculate MD5 hash:
    MD5_Init(&ctx);
    MD5_Update(&ctx, data, len);
    MD5_Final(md, &ctx);

    // Copy as ASCII string and return:
    for (c = 0; c < MD5_DIGEST_LENGTH; c++, str += 2) {
        sprintf((char *)str, "%02X", md[c]);
    }

    *(str) = '\0';
    return(ret);
}